

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

bool ORPG::Utils::print_file(string *type)

{
  undefined8 uVar1;
  bool bVar2;
  string local_58;
  undefined1 local_38 [8];
  string screen_disp;
  string *type_local;
  
  bVar2 = (Core::QUIET_FLAG & 1) == 0;
  if (bVar2) {
    screen_disp.field_2._8_8_ = type;
    std::__cxx11::string::string((string *)&local_58,(string *)type);
    get_display_screen((string *)local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    uVar1 = std::__cxx11::string::c_str();
    printf("%s\n",uVar1);
    std::__cxx11::string::~string((string *)local_38);
  }
  return bVar2;
}

Assistant:

bool print_file(string type) {
            if(Core::QUIET_FLAG) return false;

            string screen_disp = get_display_screen(type);
            printf("%s\n", screen_disp.c_str());

            return true;
        }